

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O2

void __thiscall Psbt_CreateRecordKey_Test::TestBody(Psbt_CreateRecordKey_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_d8;
  string local_d0;
  AssertionResult gtest_ar;
  ByteData key5;
  ByteData key3;
  ByteData key6;
  ByteData key4;
  ByteData key2;
  ByteData key1;
  
  cfd::core::Psbt::CreateRecordKey(&key1,'\x01');
  std::__cxx11::string::string((string *)&local_d0,"f1f2",(allocator *)&key4);
  cfd::core::ByteData::ByteData(&key3,&local_d0);
  cfd::core::Psbt::CreateRecordKey(&key2,'\x02',&key3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"abc",(allocator *)&key4);
  cfd::core::Psbt::CreateRecordKey(&key3,'\x03',&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"d1d2",(allocator *)&key6);
  cfd::core::ByteData::ByteData(&key5,&local_d0);
  cfd::core::Psbt::CreateRecordKey(&key4,'\x04',&key5,'\x05');
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key5);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"def",(allocator *)&key6);
  cfd::core::Psbt::CreateRecordKey(&key5,'\x05',&local_d0,'\t');
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"f1f2",(allocator *)&AStack_d8);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar,&local_d0);
  cfd::core::Psbt::CreateFixRecordKey(&key6,'\x06',(ByteData *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_d0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key1);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"01\"","key1.GetHex().c_str()","01",local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x480,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0202f1f2\"","key2.GetHex().c_str()","0202f1f2",
             local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x481,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key3);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0303616263\"","key3.GetHex().c_str()","0303616263",
             local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x482,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key4);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0402d1d205\"","key4.GetHex().c_str()","0402d1d205",
             local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x483,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key5);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"050364656609\"","key5.GetHex().c_str()","050364656609",
             local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x484,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&key6);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"06f1f2\"","key6.GetHex().c_str()","06f1f2",
             local_d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x485,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  return;
}

Assistant:

TEST(Psbt, CreateRecordKey) {
  auto key1 = Psbt::CreateRecordKey(1);
  auto key2 = Psbt::CreateRecordKey(2, ByteData("f1f2"));
  auto key3 = Psbt::CreateRecordKey(3, "abc");
  auto key4 = Psbt::CreateRecordKey(4, ByteData("d1d2"), 5);
  auto key5 = Psbt::CreateRecordKey(5, "def", 9);
  auto key6 = Psbt::CreateFixRecordKey(6, ByteData("f1f2"));

  EXPECT_STREQ("01", key1.GetHex().c_str());
  EXPECT_STREQ("0202f1f2", key2.GetHex().c_str());
  EXPECT_STREQ("0303616263", key3.GetHex().c_str());
  EXPECT_STREQ("0402d1d205", key4.GetHex().c_str());
  EXPECT_STREQ("050364656609", key5.GetHex().c_str());
  EXPECT_STREQ("06f1f2", key6.GetHex().c_str());
}